

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::KillImplicitRegs(LinearScan *this,Instr *instr)

{
  BitVector *pBVar1;
  Loop *pLVar2;
  long lVar3;
  code *pcVar4;
  RegNum RVar5;
  bool bVar6;
  BVIndex BVar7;
  undefined4 *puVar8;
  Loop **ppLVar9;
  BVUnitT<unsigned_long> local_28;
  BitVector _unit;
  
  if ((instr->m_kind < 6) && ((0x2cU >> (instr->m_kind & 0x1f) & 1) != 0)) {
    (this->tempRegs).word = 0;
  }
  if (instr->m_opcode != Yield) {
    if (instr->m_opcode == IMUL) {
      RVar5 = LowererMDArch::GetRegIMulHighDestLower();
      SpillReg(this,RVar5,false);
      RVar5 = LowererMDArch::GetRegIMulHighDestLower();
      BVUnitT<unsigned_long>::Clear(&this->tempRegs,(uint)RVar5);
      RVar5 = LowererMDArch::GetRegIMulHighDestLower();
      RecordLoopUse(this,(Lifetime *)0x0,RVar5);
      return;
    }
    TrackInlineeArgLifetimes(this,instr);
    bVar6 = LowererMD::IsCall(instr);
    if ((!bVar6) && ((instr->field_0x38 & 0x10) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0xd1f,"(LowererMD::IsCall(instr) || !instr->HasBailOutInfo())",
                         "LowererMD::IsCall(instr) || !instr->HasBailOutInfo()");
      if (!bVar6) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
    bVar6 = LowererMD::IsCall(instr);
    if (bVar6) {
      if (((instr->field_0x38 & 0x10) != 0) && (bVar6 = IR::Instr::HasLazyBailOut(instr), !bVar6)) {
        return;
      }
      if ((this->currentBlock->inlineeStack).
          super_ReadOnlyList<Func_*,_Memory::JitArenaAllocator,_DefaultComparer>.count < 1) {
        instr->m_func = this->func;
      }
      else {
        SpillInlineeArgs(this,instr);
      }
      local_28.word = (this->callerSavedRegs).word & (this->activeRegs).word;
      while( true ) {
        lVar3 = 0;
        if (local_28.word != 0) {
          for (; (local_28.word >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        if (local_28.word == 0) break;
        BVUnitT<unsigned_long>::Clear(&local_28,(BVIndex)lVar3);
        SpillReg(this,(RegNum)lVar3,false);
      }
      (this->tempRegs).word = (this->tempRegs).word & (this->calleeSavedRegs).word;
      BVar7 = BVUnitT<unsigned_long>::Count(&this->callSetupRegs);
      if (BVar7 != 0) {
        (this->callSetupRegs).word = 0;
      }
      ppLVar9 = &this->curLoop;
      while (pLVar2 = *ppLVar9, pLVar2 != (Loop *)0x0) {
        pBVar1 = &(pLVar2->regAlloc).regUseBv;
        pBVar1->word = pBVar1->word | (this->callerSavedRegs).word;
        ppLVar9 = &pLVar2->parent;
      }
    }
    return;
  }
  GeneratorBailIn::SpillRegsForBailIn(&this->bailIn);
  return;
}

Assistant:

void
LinearScan::KillImplicitRegs(IR::Instr *instr)
{
    if (instr->IsLabelInstr() || instr->IsBranchInstr())
    {
        // Note: need to clear these for branch as well because this info isn't recorded for second chance
        //       allocation on branch boundaries
        this->tempRegs.ClearAll();
    }

#if defined(_M_IX86) || defined(_M_X64)
    if (instr->m_opcode == Js::OpCode::IMUL)
    {
        this->SpillReg(LowererMDArch::GetRegIMulHighDestLower());
        this->tempRegs.Clear(LowererMDArch::GetRegIMulHighDestLower());

        this->RecordLoopUse(nullptr, LowererMDArch::GetRegIMulHighDestLower());
        return;
    }

    if (instr->m_opcode == Js::OpCode::Yield)
    {
        this->bailIn.SpillRegsForBailIn();
        return;
    }
#endif

    this->TrackInlineeArgLifetimes(instr);

    // Don't care about kills on bailout calls (e.g: call SaveAllRegAndBailOut) as we are going to exit anyways.
    // Note that those are different from normal helper calls with LazyBailOut because they are not guaranteed to exit.
    // Also, for bailout scenarios we have already handled the inlinee frame spills.
    // 
    // Lazy bailout:
    // Also make sure that Call instructions that previously do not have bailouts are still processed the same way in RegAlloc
    // Previously only `call SaveAllRegistersAndBailOut` can have bailout, but now other calls may have lazy bailouts too.
    // This makes them not being processed the same way as before(such as computing Lifetime across calls).
    Assert(LowererMD::IsCall(instr) || !instr->HasBailOutInfo());
    if (!LowererMD::IsCall(instr) || (instr->HasBailOutInfo() && !instr->HasLazyBailOut()))
    {
        return;
    }

    if (this->currentBlock->inlineeStack.Count() > 0)
    {
        this->SpillInlineeArgs(instr);
    }
    else
    {
        instr->m_func = this->func;
    }

    //
    // Spill caller-saved registers that are active.
    //
    BitVector deadRegs;
    deadRegs.Copy(this->activeRegs);
    deadRegs.And(this->callerSavedRegs);
    FOREACH_BITSET_IN_UNITBV(reg, deadRegs, BitVector)
    {
        this->SpillReg((RegNum)reg);
    }
    NEXT_BITSET_IN_UNITBV;
    this->tempRegs.And(this->calleeSavedRegs);

    if (callSetupRegs.Count())
    {
        callSetupRegs.ClearAll();
    }
    Loop *loop = this->curLoop;
    while (loop)
    {
        loop->regAlloc.regUseBv.Or(this->callerSavedRegs);
        loop = loop->parent;
    }
}